

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_detection.cpp
# Opt level: O0

void __thiscall ncnn::ObjectsManager::ObjectsManager(ObjectsManager *this,size_t steps)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  value_type pSVar3;
  reference ppSVar4;
  SafeOrderList<ncnn::ObjectBox> *in_RSI;
  vector<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
  *in_RDI;
  int i;
  pointer local_30;
  int local_20;
  CompareOperator in_stack_ffffffffffffffe8;
  
  memset(in_RDI,0,0x18);
  std::
  vector<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
  ::vector((vector<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
            *)0x1c75ae);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_RSI;
  in_RDI[1].
  super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       SUB168((ZEXT816(0) << 0x40 | ZEXT816(100)) / auVar1,0);
  if (in_RDI[1].
      super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
    local_30 = (pointer)0x1;
  }
  else {
    local_30 = in_RDI[1].
               super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  }
  in_RDI[1].
  super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = local_30;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = in_RDI[1].
                 super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  in_RDI[1].
  super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = SUB168((ZEXT816(0) << 0x40 | ZEXT816(100)) / auVar2,0)
  ;
  std::
  vector<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
  ::resize((vector<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
            *)in_RSI,(size_type)in_stack_ffffffffffffffe8);
  for (local_20 = 0;
      (pointer)(long)local_20 <
      in_RDI[1].
      super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
      ._M_impl.super__Vector_impl_data._M_start; local_20 = local_20 + 1) {
    pSVar3 = (value_type)operator_new(0x48);
    SafeOrderList<ncnn::ObjectBox>::SafeOrderList(in_RSI,in_stack_ffffffffffffffe8);
    ppSVar4 = std::
              vector<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
              ::operator[](in_RDI,(long)local_20);
    *ppSVar4 = pSVar3;
  }
  return;
}

Assistant:

ObjectsManager::ObjectsManager(size_t steps) : object_boxs_table()
{
    step = prob_steps_MAX / steps;
    step = step <= 0 ? 1 : step;
    prob_steps = prob_steps_MAX / step;
    object_boxs_table.resize(prob_steps);
    for (int i = 0; i < prob_steps; i++)
    {
        object_boxs_table[i] = new TObjectBoxs(object_compare);
    }
}